

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void x_connective_setup(void)

{
  pdint_setup();
  pdfloat_setup();
  pdsymbol_setup();
  bang_setup();
  send_setup();
  receive_setup();
  select_setup();
  route_setup();
  pack_setup();
  unpack_setup();
  trigger_setup();
  spigot_setup();
  moses_setup();
  until_setup();
  makefilename_setup();
  swap_setup();
  change_setup();
  value_setup();
  return;
}

Assistant:

void x_connective_setup(void)
{
    pdint_setup();
    pdfloat_setup();
    pdsymbol_setup();
    bang_setup();
    send_setup();
    receive_setup();
    select_setup();
    route_setup();
    pack_setup();
    unpack_setup();
    trigger_setup();
    spigot_setup();
    moses_setup();
    until_setup();
    makefilename_setup();
    swap_setup();
    change_setup();
    value_setup();
}